

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

PostfixExpr * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::PostfixExpr,(anonymous_namespace)::Node*&,char_const(&)[3]>
          (Db *this,Node **args,char (*args_1) [3])

{
  Node *pNVar1;
  PostfixExpr *pPVar2;
  size_t sVar3;
  
  pPVar2 = (PostfixExpr *)
           anon_unknown.dwarf_3a70a8::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x28);
  pNVar1 = *args;
  sVar3 = strlen(*args_1);
  (pPVar2->super_Expr).super_Node.K = KExpr;
  (pPVar2->super_Expr).super_Node.RHSComponentCache = No;
  (pPVar2->super_Expr).super_Node.ArrayCache = No;
  (pPVar2->super_Expr).super_Node.FunctionCache = No;
  (pPVar2->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001df0a0;
  pPVar2->Child = pNVar1;
  (pPVar2->Operand).First = *args_1;
  (pPVar2->Operand).Last = *args_1 + sVar3;
  return pPVar2;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }